

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

bool __thiscall ParseContext::Consume(ParseContext *this,char *str)

{
  bool bVar1;
  size_t sVar2;
  InplaceStr local_40;
  InplaceStr local_30;
  
  local_30.begin = this->currentLexeme->pos;
  local_30.end = local_30.begin + this->currentLexeme->length;
  local_40.begin = str;
  sVar2 = strlen(str);
  local_40.end = str + sVar2;
  bVar1 = InplaceStr::operator==(&local_30,&local_40);
  if ((bVar1) && (this->currentLexeme->type != lex_none)) {
    this->currentLexeme = this->currentLexeme + 1;
  }
  return bVar1;
}

Assistant:

bool ParseContext::Consume(const char *str)
{
	if(InplaceStr(currentLexeme->pos, currentLexeme->length) == InplaceStr(str))
	{
		Skip();
		return true;
	}

	return false;
}